

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void CMapLayers::EnvelopeEval(float TimeOffset,int Env,float *pChannels,void *pUser)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  IClient *pIVar6;
  IMap *pIVar7;
  int *piVar8;
  long in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  float fVar9;
  __type _Var10;
  __type _Var11;
  CEnvPoint *unaff_retaddr;
  float CurAnimationTick;
  float PrevAnimationTick;
  float EnvalopTicks;
  CEnvPoint *pItemPoints;
  CMapItemEnvelope *pItem;
  CLayers *pLayers;
  CEnvPoint *pPoints;
  CMapLayers *pThis;
  int Num;
  int Start;
  float local_5c;
  CLayers *local_40;
  CEnvPoint *local_38;
  int local_10;
  float in_stack_fffffffffffffff4;
  long lVar12;
  undefined4 extraout_var;
  
  lVar12 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = 0;
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  pIVar6 = CComponent::Client((CComponent *)0x16f9f3);
  iVar3 = IClient::State(pIVar6);
  if (iVar3 == 3) {
LAB_0016fa17:
    local_40 = CComponent::Layers((CComponent *)0x16fa21);
    local_38 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::base_ptr
                         ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)(in_RDX + 0x28));
  }
  else {
    pIVar6 = CComponent::Client((CComponent *)0x16fa0a);
    iVar3 = IClient::State(pIVar6);
    if (iVar3 == 4) goto LAB_0016fa17;
    local_40 = *(CLayers **)(in_RDX + 0x10);
    local_38 = array<CEnvPoint,_allocator_default<CEnvPoint>_>::base_ptr
                         ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)(in_RDX + 0x38));
  }
  pIVar7 = CLayers::Map(local_40);
  (*(pIVar7->super_IInterface)._vptr_IInterface[6])(pIVar7,3,&stack0xfffffffffffffff4,&local_10);
  if (local_10 <= in_EDI) goto LAB_0016fd12;
  pIVar7 = CLayers::Map(local_40);
  iVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[5])
                    (pIVar7,(ulong)(uint)((int)in_stack_fffffffffffffff4 + in_EDI),0);
  piVar8 = (int *)CONCAT44(extraout_var,iVar3);
  iVar3 = (local_38 + piVar8[2])[piVar8[3] + -1].super_CEnvPoint_v1.m_Time;
  iVar1 = local_38[piVar8[2]].super_CEnvPoint_v1.m_Time;
  pIVar6 = CComponent::Client((CComponent *)0x16fb0f);
  iVar4 = IClient::GameTickSpeed(pIVar6);
  pIVar6 = CComponent::Client((CComponent *)0x16fb35);
  iVar5 = IClient::State(pIVar6);
  if (iVar5 == 3) {
LAB_0016fb5d:
    if ((*(long *)(*(long *)(in_RDX + 8) + 0xdf8) != 0) &&
       (bVar2 = CGameClient::IsWorldPaused(*(CGameClient **)(in_RDX + 8)), !bVar2)) {
      if ((*piVar8 < 2) || (piVar8[0xc] != 0)) {
        pIVar6 = CComponent::Client((CComponent *)0x16fbad);
        IClient::PrevGameTick(pIVar6);
        _Var10 = std::fmod<int,float>(0,2.11072e-39);
        pIVar6 = CComponent::Client((CComponent *)0x16fbe8);
        IClient::GameTick(pIVar6);
        _Var11 = std::fmod<int,float>(0,2.110803e-39);
        local_5c = (float)_Var11;
        if (local_5c < (float)_Var10) {
          local_5c = ((float)(iVar3 - iVar1) / 1000.0) * (float)iVar4 + local_5c;
        }
        pIVar6 = CComponent::Client((CComponent *)0x16fc5a);
        fVar9 = IClient::IntraGameTick(pIVar6);
        fVar9 = mix<float,float>((float)_Var10,local_5c,fVar9);
        pIVar6 = CComponent::Client((CComponent *)0x16fc86);
        iVar3 = IClient::GameTickSpeed(pIVar6);
        EnvelopeEval::s_Time = fVar9 / (float)iVar3;
      }
      else {
        pIVar6 = CComponent::Client((CComponent *)0x16fcb0);
        fVar9 = IClient::LocalTime(pIVar6);
        EnvelopeEval::s_Time = fVar9 - *(float *)(in_RDX + 0x24);
      }
    }
  }
  else {
    pIVar6 = CComponent::Client((CComponent *)0x16fb4c);
    iVar5 = IClient::State(pIVar6);
    if (iVar5 == 4) goto LAB_0016fb5d;
    pIVar6 = CComponent::Client((CComponent *)0x16fcd8);
    EnvelopeEval::s_Time = IClient::LocalTime(pIVar6);
  }
  CRenderTools::RenderEvalEnvelope
            (unaff_retaddr,(int)((ulong)lVar12 >> 0x20),(int)lVar12,in_stack_fffffffffffffff4,
             (float *)CONCAT44(in_XMM0_Da,in_EDI));
LAB_0016fd12:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar12) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::EnvelopeEval(float TimeOffset, int Env, float *pChannels, void *pUser)
{
	CMapLayers *pThis = (CMapLayers *)pUser;
	pChannels[0] = 0;
	pChannels[1] = 0;
	pChannels[2] = 0;
	pChannels[3] = 0;

	CEnvPoint *pPoints = 0;
	CLayers *pLayers = 0;
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		pLayers = pThis->Layers();
		pPoints = pThis->m_lEnvPoints.base_ptr();
	}
	else
	{
		pLayers = pThis->m_pMenuLayers;
		pPoints = pThis->m_lEnvPointsMenu.base_ptr();
	}

	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);

	if(Env >= Num)
		return;

	const CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+Env, 0, 0);
	CEnvPoint *pItemPoints = pPoints + pItem->m_StartPoint;

	static float s_Time = 0.0f;
	float EnvalopTicks = (pItemPoints[pItem->m_NumPoints-1].m_Time - pItemPoints[0].m_Time)/1000.0f * pThis->Client()->GameTickSpeed();
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		if(pThis->m_pClient->m_Snap.m_pGameData && !pThis->m_pClient->IsWorldPaused())
		{
			if(pItem->m_Version < 2 || pItem->m_Synchronized)
			{
				float PrevAnimationTick = fmod(pThis->Client()->PrevGameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				float CurAnimationTick = fmod(pThis->Client()->GameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				if(PrevAnimationTick > CurAnimationTick)
					CurAnimationTick += EnvalopTicks;
				s_Time = mix(PrevAnimationTick, CurAnimationTick, pThis->Client()->IntraGameTick()) / pThis->Client()->GameTickSpeed();
			}
			else
				s_Time = pThis->Client()->LocalTime() - pThis->m_OnlineStartTime;
		}
	}
	else
	{
		s_Time = pThis->Client()->LocalTime();
	}
	CRenderTools::RenderEvalEnvelope(pItemPoints, pItem->m_NumPoints, 4, s_Time + TimeOffset, pChannels);
}